

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

string * __thiscall
booster::locale::impl_icu::calendar_impl::get_timezone_abi_cxx11_(calendar_impl *this)

{
  long in_RSI;
  string *in_RDI;
  icu_std_converter<char,_1> cvt;
  UnicodeString tz;
  UnicodeString *in_stack_ffffffffffffff28;
  string *this_00;
  string local_b0 [4];
  cpcvt_type in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff60;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff68;
  UnicodeString local_50 [80];
  
  this_00 = in_RDI;
  icu_70::UnicodeString::UnicodeString((UnicodeString *)in_RDI);
  hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RSI + 0x50));
  icu_70::Calendar::getTimeZone();
  icu_70::TimeZone::getID((TimeZone *)this_00,in_stack_ffffffffffffff28);
  std::__cxx11::string::string(local_b0,(string *)(in_RSI + 0x30));
  icu_std_converter<char,_1>::icu_std_converter
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  std::__cxx11::string::~string(local_b0);
  icu_std_converter<char,1>::std_abi_cxx11_
            (in_stack_ffffffffffffff68,(UnicodeString *)in_stack_ffffffffffffff60);
  icu_std_converter<char,_1>::~icu_std_converter((icu_std_converter<char,_1> *)0x266154);
  icu_70::UnicodeString::~UnicodeString(local_50);
  return in_RDI;
}

Assistant:

virtual std::string get_timezone() const 
        {
            icu::UnicodeString tz;
            calendar_->getTimeZone().getID(tz);
            icu_std_converter<char> cvt(encoding_);
            return cvt.std(tz);
        }